

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O0

void cio_random_get_bytes(cio_rng_t *rng,void *bytes,size_t num_bytes)

{
  uint32_t uVar1;
  undefined8 local_30;
  size_t i;
  uint8_t *dest;
  size_t num_bytes_local;
  void *bytes_local;
  cio_rng_t *rng_local;
  
  i = (size_t)bytes;
  for (local_30 = 0; local_30 < num_bytes; local_30 = local_30 + 1) {
    uVar1 = pcg32_random_r(rng);
    *(char *)i = (char)uVar1;
    i = i + 1;
  }
  return;
}

Assistant:

void cio_random_get_bytes(cio_rng_t *rng, void *bytes, size_t num_bytes)
{
	uint8_t *dest = bytes;
	for (size_t i = 0; i < num_bytes; i++) {
		*dest = (uint8_t)pcg32_random_r(rng);
		dest++;
	}
}